

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

void __thiscall
QSqlRelationalTableModelPrivate::translateFieldNames
          (QSqlRelationalTableModelPrivate *this,QSqlRecord *values)

{
  QSqlRecord *this_00;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  QList<QSharedPointer<QRelation>_> *in_RSI;
  QSqlRecord *in_RDI;
  long in_FS_OFFSET;
  bool gen;
  int i;
  QVariant v;
  QList<QSharedPointer<QRelation>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined2 in_stack_ffffffffffffff78;
  byte bVar4;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  int pos;
  int iVar6;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pos = 0;
  while (iVar6 = pos, iVar3 = QSqlRecord::count((QSqlRecord *)0x15b4fa), pos < iVar3) {
    QList<QSharedPointer<QRelation>_>::value(in_RSI,CONCAT44(iVar6,in_stack_ffffffffffffff88));
    bVar2 = QSharedPointer::operator_cast_to_bool((QSharedPointer<QRelation> *)0x15b52d);
    bVar4 = false;
    if (bVar2) {
      QList<QSharedPointer<QRelation>_>::at
                ((QList<QSharedPointer<QRelation>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (qsizetype)in_stack_ffffffffffffff68);
      QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15b55a);
      bVar4 = QRelation::isValid((QRelation *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    uVar5 = bVar4;
    QSharedPointer<QRelation>::~QSharedPointer((QSharedPointer<QRelation> *)0x15b578);
    if ((bVar4 & 1) != 0) {
      local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
      local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QSqlRecord::value((QSqlRecord *)CONCAT44(iVar6,in_stack_ffffffffffffff88),
                        (int)((ulong)in_RDI >> 0x20));
      this_00 = (QSqlRecord *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      uVar1 = (ulong)in_stack_ffffffffffffff68 >> 0x20;
      in_stack_ffffffffffffff74 = iVar6;
      in_stack_ffffffffffffff68 = in_RSI;
      bVar2 = QSqlRecord::isGenerated(this_00,(int)uVar1);
      in_stack_ffffffffffffff88 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff88);
      iVar6 = in_stack_ffffffffffffff74;
      in_RSI = in_stack_ffffffffffffff68;
      QSqlRecord::field((QSqlRecord *)
                        CONCAT44(pos,CONCAT13(uVar5,CONCAT12(bVar4,in_stack_ffffffffffffff78))),
                        in_stack_ffffffffffffff74);
      QSqlRecord::replace(in_RDI,pos,
                          (QSqlField *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                         );
      QSqlField::~QSqlField
                ((QSqlField *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      QSqlRecord::setValue
                (in_RDI,pos,
                 (QVariant *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      QSqlRecord::setGenerated
                ((QSqlRecord *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffff68 >> 0x18,0));
      QVariant::~QVariant((QVariant *)&local_28);
    }
    pos = iVar6 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSqlRelationalTableModelPrivate::translateFieldNames(QSqlRecord &values) const
{
    for (int i = 0; i < values.count(); ++i) {
        if (relations.value(i) && relations.at(i)->isValid()) {
            QVariant v = values.value(i);
            bool gen = values.isGenerated(i);
            values.replace(i, baseRec.field(i));
            values.setValue(i, v);
            values.setGenerated(i, gen);
        }
    }
}